

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SemanticAnalyzer.cpp
# Opt level: O0

optional<VariableDefinition> * __thiscall
Scope::findLocally(optional<VariableDefinition> *__return_storage_ptr__,Scope *this,
                  string *variableName,bool considerPartiallyBound)

{
  bool bVar1;
  pointer ppVar2;
  undefined1 local_58 [8];
  VariableDefinition vd;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VariableDefinition>,_true>
  local_38;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VariableDefinition>,_true>
  local_30;
  iterator find;
  bool considerPartiallyBound_local;
  string *variableName_local;
  Scope *this_local;
  
  find.
  super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VariableDefinition>,_true>
  ._M_cur._7_1_ = considerPartiallyBound;
  local_30._M_cur =
       (__node_type *)
       std::
       unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VariableDefinition,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VariableDefinition>_>_>
       ::find(&this->localScope,variableName);
  local_38._M_cur =
       (__node_type *)
       std::
       unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VariableDefinition,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VariableDefinition>_>_>
       ::end(&this->localScope);
  bVar1 = std::__detail::operator==(&local_30,&local_38);
  if (bVar1) {
    std::optional<VariableDefinition>::optional(__return_storage_ptr__);
  }
  else {
    ppVar2 = std::__detail::
             _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VariableDefinition>,_false,_true>
             ::operator->((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VariableDefinition>,_false,_true>
                           *)&local_30);
    VariableDefinition::VariableDefinition((VariableDefinition *)local_58,&ppVar2->second);
    if (((byte)vd.token.super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi & 1)
        == 0) {
      if ((find.
           super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VariableDefinition>,_true>
           ._M_cur._7_1_ & 1) == 0) {
        std::optional<VariableDefinition>::optional(__return_storage_ptr__);
      }
      else {
        std::optional<VariableDefinition>::optional<VariableDefinition,_true>
                  (__return_storage_ptr__,(VariableDefinition *)local_58);
      }
    }
    else {
      std::optional<VariableDefinition>::optional<VariableDefinition,_true>
                (__return_storage_ptr__,(VariableDefinition *)local_58);
    }
    VariableDefinition::~VariableDefinition((VariableDefinition *)local_58);
  }
  return __return_storage_ptr__;
}

Assistant:

std::optional<VariableDefinition> findLocally(const std::string & variableName, bool considerPartiallyBound) {

    auto find = this->localScope.find(variableName);

    if (find == this->localScope.end()) {
      return std::nullopt;
    }

    VariableDefinition vd = find->second;

    if (!vd.isFullyBound) {
      if (considerPartiallyBound) {
        return vd;
      }

      return std::nullopt;
    }

    return vd;
  }